

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_bs.c
# Opt level: O1

int jpc_bitstream_fillbuf(jpc_bitstream_t *bitstream)

{
  jas_stream_t *stream;
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  if ((bitstream->openmode_ & 1) == 0) {
    __assert_fail("bitstream->openmode_ & JPC_BITSTREAM_READ",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_bs.c"
                  ,0xf6,"int jpc_bitstream_fillbuf(jpc_bitstream_t *)");
  }
  if (bitstream->cnt_ < 1) {
    if ((bitstream->flags_ & 4U) == 0) {
      if ((bitstream->flags_ & 2U) == 0) {
        bitstream->buf_ = (ulong)(((uint)bitstream->buf_ & 0xff) << 8);
        stream = bitstream->stream_;
        uVar2 = 0xffffffff;
        if ((stream->flags_ & 7U) == 0) {
          if ((stream->rwlimit_ < 0) || (stream->rwcnt_ < stream->rwlimit_)) {
            iVar3 = stream->cnt_;
            stream->cnt_ = iVar3 + -1;
            if (iVar3 < 1) {
              uVar2 = jas_stream_fillbuf(stream,1);
            }
            else {
              stream->rwcnt_ = stream->rwcnt_ + 1;
              pbVar1 = stream->ptr_;
              stream->ptr_ = pbVar1 + 1;
              uVar2 = (uint)*pbVar1;
            }
          }
          else {
            stream->flags_ = stream->flags_ | 4;
          }
        }
        if (uVar2 != 0xffffffff) {
          uVar4 = bitstream->buf_ == 0xff00 ^ 7;
          bitstream->cnt_ = uVar4;
          uVar5 = (ulong)((2 << (sbyte)uVar4) - 1U & uVar2) | bitstream->buf_;
          bitstream->buf_ = uVar5;
          return (uint)(((uint)uVar5 >> uVar4 & 1) != 0);
        }
        *(byte *)&bitstream->flags_ = (byte)bitstream->flags_ | 2;
      }
      else {
        bitstream->buf_ = 0x7f;
        bitstream->cnt_ = 7;
      }
      iVar3 = 1;
    }
    else {
      bitstream->cnt_ = 0;
      iVar3 = -1;
    }
    return iVar3;
  }
  __assert_fail("bitstream->cnt_ <= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_bs.c"
                ,0xf7,"int jpc_bitstream_fillbuf(jpc_bitstream_t *)");
}

Assistant:

int jpc_bitstream_fillbuf(jpc_bitstream_t *bitstream)
{
	int c;
	/* Note: The count has already been decremented by the caller. */
	assert(bitstream->openmode_ & JPC_BITSTREAM_READ);
	assert(bitstream->cnt_ <= 0);

	if (bitstream->flags_ & JPC_BITSTREAM_ERR) {
		bitstream->cnt_ = 0;
		return -1;
	}

	if (bitstream->flags_ & JPC_BITSTREAM_EOF) {
		bitstream->buf_ = 0x7f;
		bitstream->cnt_ = 7;
		return 1;
	}

	bitstream->buf_ = (bitstream->buf_ << 8) & 0xffff;
	if ((c = jas_stream_getc((bitstream)->stream_)) == EOF) {
		bitstream->flags_ |= JPC_BITSTREAM_EOF;
		return 1;
	}
	bitstream->cnt_ = (bitstream->buf_ == 0xff00) ? 6 : 7;
	bitstream->buf_ |= c & ((1 << (bitstream->cnt_ + 1)) - 1);
	return (bitstream->buf_ >> bitstream->cnt_) & 1;
}